

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_DynamicCastMessage_Test::TestBody
          (LiteTest_DynamicCastMessage_Test *this)

{
  TestPackedTypesLite *pTVar1;
  TestAllTypesLite *this_00;
  pointer *__ptr;
  _func_int **pp_Var2;
  char *pcVar3;
  shared_ptr<proto2_unittest::TestPackedTypesLite> shared_2;
  shared_ptr<proto2_unittest::TestAllTypesLite> shared_1;
  shared_ptr<google::protobuf::MessageLite> shared;
  AssertHelper local_3a8;
  AssertionResult gtest_ar_10;
  AssertHelper local_390;
  __shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2> local_388;
  __shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2> local_378;
  CastType1 test_type_1;
  
  proto2_unittest::TestAllTypesLite::TestAllTypesLite(&test_type_1);
  shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = &test_type_1;
  shared_2.super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           DynamicCastMessage<proto2_unittest::TestAllTypesLite>(&test_type_1.super_MessageLite);
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypesLite*,proto2_unittest::TestAllTypesLite*>
            ((internal *)&shared,"&test_type_1","DynamicCastMessage<CastType1>(test_type_1_pointer)"
             ,(TestAllTypesLite **)&shared_1,(TestAllTypesLite **)&shared_2);
  if ((char)shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == '\0') {
    testing::Message::Message((Message *)&shared_1);
    if (shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var2 = (_func_int **)0x252db7;
    }
    else {
      pp_Var2 = (shared.
                 super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&shared_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x555,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&shared_2,(Message *)&shared_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&shared_2);
    if (shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      (*((shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&shared.
                    super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  pTVar1 = DynamicCastMessage<proto2_unittest::TestPackedTypesLite>(&test_type_1.super_MessageLite);
  testing::internal::EqHelper::Compare<proto2_unittest::TestPackedTypesLite>
            ((EqHelper *)&shared,"nullptr","DynamicCastMessage<CastType2>(test_type_1_pointer)",
             (nullptr_t)0x0,pTVar1);
  if ((char)shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == '\0') {
    testing::Message::Message((Message *)&shared_1);
    if (shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var2 = (_func_int **)0x252db7;
    }
    else {
      pp_Var2 = (shared.
                 super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&shared_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x556,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&shared_2,(Message *)&shared_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&shared_2);
    if (shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      (*((shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&shared.
                    super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = &test_type_1;
  shared_2.super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           DynamicCastMessage<proto2_unittest::TestAllTypesLite_const>
                     (&test_type_1.super_MessageLite);
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypesLite*,proto2_unittest::TestAllTypesLite_const*>
            ((internal *)&shared,"&test_type_1",
             "DynamicCastMessage<const CastType1>(test_type_1_pointer_const)",
             (TestAllTypesLite **)&shared_1,(TestAllTypesLite **)&shared_2);
  if ((char)shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == '\0') {
    testing::Message::Message((Message *)&shared_1);
    if (shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var2 = (_func_int **)0x252db7;
    }
    else {
      pp_Var2 = (shared.
                 super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&shared_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x55a,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&shared_2,(Message *)&shared_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&shared_2);
    if (shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      (*((shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&shared.
                    super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  pTVar1 = DynamicCastMessage<proto2_unittest::TestPackedTypesLite_const>
                     (&test_type_1.super_MessageLite);
  testing::internal::EqHelper::Compare<proto2_unittest::TestPackedTypesLite_const>
            ((EqHelper *)&shared,"nullptr",
             "DynamicCastMessage<const CastType2>(test_type_1_pointer_const)",(nullptr_t)0x0,pTVar1)
  ;
  if ((char)shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == '\0') {
    testing::Message::Message((Message *)&shared_1);
    if (shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var2 = (_func_int **)0x252db7;
    }
    else {
      pp_Var2 = (shared.
                 super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&shared_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x55c,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&shared_2,(Message *)&shared_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&shared_2);
    if (shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      (*((shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&shared.
                    super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  testing::internal::EqHelper::Compare<proto2_unittest::TestAllTypesLite>
            ((EqHelper *)&shared,"nullptr",
             "DynamicCastMessage<CastType1>(test_type_1_pointer_nullptr)",(nullptr_t)0x0,
             (TestAllTypesLite *)0x0);
  if ((char)shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == '\0') {
    testing::Message::Message((Message *)&shared_1);
    if (shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var2 = (_func_int **)0x252db7;
    }
    else {
      pp_Var2 = (shared.
                 super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&shared_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x560,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&shared_2,(Message *)&shared_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&shared_2);
    if (shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      (*((shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&shared.
                    super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = &test_type_1;
  shared_2.super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           DynamicCastMessage<proto2_unittest::TestAllTypesLite>(&test_type_1.super_MessageLite);
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypesLite*,proto2_unittest::TestAllTypesLite*>
            ((internal *)&shared,"&test_type_1",
             "&DynamicCastMessage<CastType1>(test_type_1_pointer_ref)",
             (TestAllTypesLite **)&shared_1,(TestAllTypesLite **)&shared_2);
  if ((char)shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == '\0') {
    testing::Message::Message((Message *)&shared_1);
    if (shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var2 = (_func_int **)0x252db7;
    }
    else {
      pp_Var2 = (shared.
                 super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&shared_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x564,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&shared_2,(Message *)&shared_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&shared_2);
    if (shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      (*((shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&shared.
                    super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = &test_type_1;
  shared_2.super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           DynamicCastMessage<proto2_unittest::TestAllTypesLite>(&test_type_1.super_MessageLite);
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypesLite*,proto2_unittest::TestAllTypesLite_const*>
            ((internal *)&shared,"&test_type_1",
             "&DynamicCastMessage<CastType1>(test_type_1_pointer_const_ref)",
             (TestAllTypesLite **)&shared_1,(TestAllTypesLite **)&shared_2);
  if ((char)shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == '\0') {
    testing::Message::Message((Message *)&shared_1);
    if (shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var2 = (_func_int **)0x252db7;
    }
    else {
      pp_Var2 = (shared.
                 super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&shared_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x568,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&shared_2,(Message *)&shared_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&shared_2);
    if (shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      (*((shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&shared.
                    super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  this_00 = (TestAllTypesLite *)operator_new(0x348);
  proto2_unittest::TestAllTypesLite::TestAllTypesLite(this_00);
  std::__shared_ptr<google::protobuf::MessageLite,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<proto2_unittest::TestAllTypesLite,void>
            ((__shared_ptr<google::protobuf::MessageLite,(__gnu_cxx::_Lock_policy)2> *)&shared,
             this_00);
  gtest_ar_10._0_4_ = 1;
  if (shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    shared_2.super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
  }
  else {
    shared_2.super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             (long)(shared.
                    super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&shared_1,"1","shared.use_count()",(int *)&gtest_ar_10,(long *)&shared_2);
  if ((char)shared_1.
            super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == '\0') {
    testing::Message::Message((Message *)&shared_2);
    if (shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var2 = (_func_int **)0x252db7;
    }
    else {
      pp_Var2 = (shared_1.
                 super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x56b,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&shared_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
    if (shared_2.
        super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      (*((shared_2.
          super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&shared_1.
                    super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  std::__shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_378,
             &shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>);
  DynamicCastMessage<proto2_unittest::TestAllTypesLite>
            ((protobuf *)&shared_1,(shared_ptr<google::protobuf::MessageLite> *)&local_378);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_378._M_refcount);
  local_3a8.data_._0_4_ = 2;
  if (shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    gtest_ar_10._0_8_ = 0;
  }
  else {
    gtest_ar_10._0_8_ =
         SEXT48((shared.
                 super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count);
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&shared_2,"2","shared.use_count()",(int *)&local_3a8,(long *)&gtest_ar_10);
  if ((char)shared_2.
            super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == '\0') {
    testing::Message::Message((Message *)&gtest_ar_10);
    if (shared_2.
        super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var2 = (_func_int **)0x252db7;
    }
    else {
      pp_Var2 = (shared_2.
                 super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x56f,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&gtest_ar_10);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (gtest_ar_10._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_10._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&shared_2.
                    super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  gtest_ar_10._0_8_ =
       shared_1.super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  testing::internal::CmpHelperEQ<proto2_unittest::TestAllTypesLite*,google::protobuf::MessageLite*>
            ((internal *)&shared_2,"shared_1.get()","shared.get()",(TestAllTypesLite **)&gtest_ar_10
             ,(MessageLite **)&local_3a8);
  if ((char)shared_2.
            super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == '\0') {
    testing::Message::Message((Message *)&gtest_ar_10);
    if (shared_2.
        super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var2 = (_func_int **)0x252db7;
    }
    else {
      pp_Var2 = (shared_2.
                 super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x570,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&gtest_ar_10);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (gtest_ar_10._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_10._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&shared_2.
                    super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  std::__shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_388,
             &shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>);
  DynamicCastMessage<proto2_unittest::TestPackedTypesLite>
            ((protobuf *)&shared_2,(shared_ptr<google::protobuf::MessageLite> *)&local_388);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_388._M_refcount);
  local_390.data_._0_4_ = 2;
  if (shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_3a8.data_ = (AssertHelperData *)0x0;
  }
  else {
    local_3a8.data_ =
         (AssertHelperData *)
         (long)(shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count;
  }
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar_10,"2","shared.use_count()",(int *)&local_390,(long *)&local_3a8)
  ;
  if (gtest_ar_10.success_ == false) {
    testing::Message::Message((Message *)&local_3a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_10.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_10.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x572,pcVar3);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3a8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_10.message_);
  local_3a8.data_ = (AssertHelperData *)0x0;
  testing::internal::
  CmpHelperEQ<std::shared_ptr<proto2_unittest::TestPackedTypesLite>,decltype(nullptr)>
            ((internal *)&gtest_ar_10,"shared_2","nullptr",&shared_2,&local_3a8.data_);
  if (gtest_ar_10.success_ == false) {
    testing::Message::Message((Message *)&local_3a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_10.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar_10.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x573,pcVar3);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3a8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_10.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&shared_2.
              super___shared_ptr<proto2_unittest::TestPackedTypesLite,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&shared_1.
              super___shared_ptr<proto2_unittest::TestAllTypesLite,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&shared.super___shared_ptr<google::protobuf::MessageLite,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  proto2_unittest::TestAllTypesLite::~TestAllTypesLite(&test_type_1);
  return;
}

Assistant:

TEST(LiteTest, DynamicCastMessage) {
  CastType1 test_type_1;

  MessageLite* test_type_1_pointer = &test_type_1;
  EXPECT_EQ(&test_type_1, DynamicCastMessage<CastType1>(test_type_1_pointer));
  EXPECT_EQ(nullptr, DynamicCastMessage<CastType2>(test_type_1_pointer));

  const MessageLite* test_type_1_pointer_const = &test_type_1;
  EXPECT_EQ(&test_type_1,
            DynamicCastMessage<const CastType1>(test_type_1_pointer_const));
  EXPECT_EQ(nullptr,
            DynamicCastMessage<const CastType2>(test_type_1_pointer_const));

  MessageLite* test_type_1_pointer_nullptr = nullptr;
  EXPECT_EQ(nullptr,
            DynamicCastMessage<CastType1>(test_type_1_pointer_nullptr));

  MessageLite& test_type_1_pointer_ref = test_type_1;
  EXPECT_EQ(&test_type_1,
            &DynamicCastMessage<CastType1>(test_type_1_pointer_ref));

  const MessageLite& test_type_1_pointer_const_ref = test_type_1;
  EXPECT_EQ(&test_type_1,
            &DynamicCastMessage<CastType1>(test_type_1_pointer_const_ref));

  std::shared_ptr<MessageLite> shared(new CastType1);
  EXPECT_EQ(1, shared.use_count());
  std::shared_ptr<CastType1> shared_1 = DynamicCastMessage<CastType1>(shared);
  // Check that both shared_ptr instances are pointing to the same control
  // block by checking use_count().
  EXPECT_EQ(2, shared.use_count());
  EXPECT_EQ(shared_1.get(), shared.get());
  std::shared_ptr<CastType2> shared_2 = DynamicCastMessage<CastType2>(shared);
  EXPECT_EQ(2, shared.use_count());
  EXPECT_EQ(shared_2, nullptr);
}